

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::tessellation::anon_unknown_2::PassthroughTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PassthroughTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar1;
  undefined8 *puVar2;
  int aiVar3 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  Buffer *pBVar5;
  Allocation *pAVar6;
  undefined8 uVar7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  TestStatus *pTVar8;
  IVec2 pipelineLayout;
  IVec2 obj;
  IVec2 commandBuffer;
  Handle<(vk::HandleType)14> HVar9;
  DeviceInterface *pDVar10;
  VkDevice pVVar11;
  bool bVar12;
  deUint32 dVar13;
  int iVar14;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  TextureFormat TVar15;
  ulong uVar16;
  GraphicsPipelineBuilder *pGVar17;
  const_iterator cVar18;
  TessPrimitiveType primitiveType;
  VkImageLayout oldLayout;
  IVec2 IVar19;
  int iVar20;
  VkDeviceSize VVar21;
  long lVar22;
  Buffer **ppBVar23;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  undefined4 uVar24;
  IVec2 renderSize;
  ConstPixelBufferAccess image0;
  ConstPixelBufferAccess image1;
  Buffer *colorBuffer [2];
  TextureFormat local_448;
  long *plStack_440;
  DeviceInterface *local_438;
  VkDevice pVStack_430;
  VkRenderPass local_428;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_420;
  TestStatus *local_408;
  VkQueue local_400;
  IVec3 positionDeviation;
  UVec4 colorThreshold;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_3d0;
  TextureFormat local_3b8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_3b0;
  GraphicsPipelineBuilder pipelineBuilder;
  Image colorAttachmentImage;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_190;
  VkFramebuffer local_178;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_170;
  VkImageView local_158;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_150;
  VkDescriptorPool local_138;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_130;
  Buffer vertexBuffer;
  Buffer tessLevelsBuffer;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  Buffer colorBuffer2;
  Buffer colorBuffer1;
  
  local_408 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_400 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar13 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)&pipelineBuilder,0x18,0x20);
  tessellation::Buffer::Buffer
            (&tessLevelsBuffer,vk,device,allocator,(VkBufferCreateInfo *)&pipelineBuilder,
             (MemoryRequirement)0x1);
  if ((this->m_params).useTessLevels == true) {
    puVar2 = (undefined8 *)
             (tessLevelsBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    puVar2[2] = *(undefined8 *)((this->m_params).tessLevels.outer + 2);
    uVar7 = *(undefined8 *)(this->m_params).tessLevels.outer;
    *puVar2 = *(undefined8 *)(this->m_params).tessLevels.inner;
    puVar2[1] = uVar7;
    ::vk::flushMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((tessLevelsBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (tessLevelsBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0x18);
  }
  VVar21 = (long)(this->m_params).vertices.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_params).vertices.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)&pipelineBuilder,VVar21,0x80);
  tessellation::Buffer::Buffer
            (&vertexBuffer,vk,device,allocator,(VkBufferCreateInfo *)&pipelineBuilder,
             (MemoryRequirement)0x1);
  pAVar6 = vertexBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memcpy((vertexBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,
         (this->m_params).vertices.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start,VVar21);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,VVar21);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&pipelineBuilder);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&pipelineBuilder,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,2,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&image0,this_00,vk,device,0);
  DStack_3b0.m_device = (VkDevice)image0._16_8_;
  DStack_3b0.m_allocator = (VkAllocationCallbacks *)image0.m_pitch.m_data._4_8_;
  local_3b8 = image0.m_format;
  DStack_3b0.m_deviceIface = (DeviceInterface *)image0.m_size.m_data._0_8_;
  image0.m_format.order = R;
  image0.m_format.type = SNORM_INT8;
  image0.m_size.m_data[0] = 0;
  image0.m_size.m_data[1] = 0;
  image0.m_size.m_data[2] = 0;
  image0.m_pitch.m_data[0] = 0;
  image0.m_pitch.m_data[1] = 0;
  image0.m_pitch.m_data[2] = 0;
  if (pipelineBuilder.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface,
                    (long)pipelineBuilder.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)pipelineBuilder.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if (pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_device != (VkDevice)0x0) {
    operator_delete(pipelineBuilder.m_vertexShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device,
                    pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal -
                    (long)pipelineBuilder.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  if (pipelineBuilder.m_renderSize.m_data != (int  [2])0x0) {
    operator_delete((void *)pipelineBuilder.m_renderSize.m_data,
                    (long)pipelineBuilder.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                          m_deviceIface - (long)pipelineBuilder.m_renderSize.m_data);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&image0);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&image0,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&pipelineBuilder,this_01,vk,device,1,1);
  DStack_130.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_130.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_138.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_138.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_130.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  pipelineBuilder.m_renderSize.m_data[0] = 0;
  pipelineBuilder.m_renderSize.m_data[1] = 0;
  pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
  .m_deviceIface = (DeviceInterface *)0x0;
  pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
  .m_device = (VkDevice)0x0;
  if (image0.m_format != (TextureFormat)0x0) {
    operator_delete((void *)image0.m_format,image0._16_8_ - (long)image0.m_format);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&pipelineBuilder,vk,device,local_138,
                    (VkDescriptorSetLayout)local_3b8);
  local_438 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
              m_data.deleter.m_deviceIface;
  pVStack_430 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                m_data.deleter.m_device;
  local_448.order = pipelineBuilder.m_renderSize.m_data[0];
  local_448.type = pipelineBuilder.m_renderSize.m_data[1];
  plStack_440 = (long *)pipelineBuilder.m_vertexShaderModule.
                        super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&pipelineBuilder);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&pipelineBuilder,local_448.order,(void *)0x0,0)
  ;
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (pipelineBuilder.m_fragmentShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_deviceIface != (DeviceInterface *)0x0) {
    operator_delete(pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface,
                    (long)pipelineBuilder.m_fragmentShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
                    - (long)pipelineBuilder.m_fragmentShaderModule.
                            super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                            m_deviceIface);
  }
  if (pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
      deleter.m_device != (VkDevice)0x0) {
    operator_delete(pipelineBuilder.m_vertexShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device,
                    pipelineBuilder.m_fragmentShaderModule.
                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal -
                    (long)pipelineBuilder.m_vertexShaderModule.
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&pipelineBuilder);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)&pipelineBuilder,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,
                      0x11,1);
  Image::Image(&colorAttachmentImage,vk,device,allocator,(VkImageCreateInfo *)&pipelineBuilder,
               (MemoryRequirement)0x0);
  iVar20 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar15 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar14 = tcu::getPixelSize(TVar15);
  VVar21 = (VkDeviceSize)(iVar20 * iVar14);
  makeBufferCreateInfo((VkBufferCreateInfo *)&pipelineBuilder,VVar21,2);
  tessellation::Buffer::Buffer
            (&colorBuffer1,vk,device,allocator,(VkBufferCreateInfo *)&pipelineBuilder,
             (MemoryRequirement)0x1);
  makeBufferCreateInfo((VkBufferCreateInfo *)&pipelineBuilder,VVar21,2);
  tessellation::Buffer::Buffer
            (&colorBuffer2,vk,device,allocator,(VkBufferCreateInfo *)&pipelineBuilder,
             (MemoryRequirement)0x1);
  subresourceRange.levelCount._0_1_ = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange._9_7_ = 0;
  subresourceRange.layerCount = 1;
  colorBuffer[0] = &colorBuffer1;
  colorBuffer[1] = &colorBuffer2;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&pipelineBuilder,vk,device,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  DStack_150.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_150.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_158.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_158.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_150.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineBuilder,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  DStack_420.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_420.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_428.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_428.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_420.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&pipelineBuilder,vk,device,
                  (VkRenderPass)pipelineBuilder.m_renderSize.m_data,local_158,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  DStack_170.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_170.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  local_178.m_internal._0_4_ = pipelineBuilder.m_renderSize.m_data[0];
  local_178.m_internal._4_4_ = pipelineBuilder.m_renderSize.m_data[1];
  DStack_170.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&pipelineBuilder,vk,device,
                     (VkDescriptorSetLayout)local_3b8);
  pipelineLayout = pipelineBuilder.m_renderSize;
  DStack_3d0.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_3d0.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  DStack_3d0.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&pipelineBuilder,vk,device,dVar13);
  obj = pipelineBuilder.m_renderSize;
  DStack_190.m_device =
       (VkDevice)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_deviceIface;
  DStack_190.m_allocator =
       (VkAllocationCallbacks *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter.m_device;
  DStack_190.m_deviceIface =
       (DeviceInterface *)
       pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       object.m_internal;
  IVar19 = pipelineBuilder.m_renderSize;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&pipelineBuilder,vk,device,
             (VkCommandPool)pipelineBuilder.m_renderSize.m_data,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pVVar11 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
            m_data.deleter.m_device;
  pDVar10 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
            m_data.deleter.m_deviceIface;
  HVar9 = pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
          .object;
  commandBuffer = pipelineBuilder.m_renderSize;
  primitiveType = IVar19.m_data[0];
  pMVar1 = &pipelineBuilder.m_vertexShaderModule;
  aiVar3 = (int  [2])((this->super_TestInstance).m_context)->m_testCtx->m_log;
  pipelineBuilder.m_renderSize.m_data = aiVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pMVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pMVar1,(this->m_params).message._M_dataplus._M_p,
             (this->m_params).message._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&pipelineBuilder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pMVar1);
  std::ios_base::~ios_base
            ((ios_base *)
             &pipelineBuilder.m_tessControlShaderModule.
              super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  if ((this->m_params).useTessLevels == true) {
    pMVar1 = &pipelineBuilder.m_vertexShaderModule;
    pipelineBuilder.m_renderSize.m_data = aiVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pMVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pMVar1,"Tessellation levels: ",0x15);
    getTessellationLevelsString_abi_cxx11_
              ((string *)&image0,(tessellation *)&(this->m_params).tessLevels,
               (TessLevels *)(ulong)(this->m_params).primitiveType,primitiveType);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pMVar1,(char *)image0.m_format,image0.m_size.m_data._0_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&pipelineBuilder,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (image0.m_format != (TextureFormat)(image0.m_size.m_data + 2)) {
      operator_delete((void *)image0.m_format,image0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pMVar1);
    std::ios_base::~ios_base
              ((ios_base *)
               &pipelineBuilder.m_tessControlShaderModule.
                super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  }
  ppBVar23 = colorBuffer;
  lVar22 = 0;
  do {
    memset(&pipelineBuilder,0,0xfc);
    pipelineBuilder.m_patchControlPoints = 1;
    uVar16 = (ulong)(this->m_params).primitiveType;
    pipelineBuilder.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_LAST;
    if (uVar16 < 3) {
      pipelineBuilder.m_primitiveTopology = *(VkPrimitiveTopology *)(&DAT_00b4ab60 + uVar16 * 4);
    }
    pipelineBuilder.m_renderSize = renderSize;
    pipelineBuilder.m_blendEnable = true;
    TVar15 = ::vk::mapVkFormat(VK_FORMAT_R32G32B32A32_SFLOAT);
    dVar13 = tcu::getPixelSize(TVar15);
    pGVar17 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                        (&pipelineBuilder,VK_FORMAT_R32G32B32A32_SFLOAT,dVar13);
    pGVar17->m_patchControlPoints = (this->m_params).inputPatchVertices;
    p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)((this->super_TestInstance).m_context)->m_progCollection;
    image0.m_format = (TextureFormat)(image0.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&image0,"vert","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var4,(key_type *)&image0);
    pGVar17 = GraphicsPipelineBuilder::setShader
                        (pGVar17,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                         *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
    p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)((this->super_TestInstance).m_context)->m_progCollection;
    image1.m_format = (TextureFormat)(image1.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&image1,"frag","");
    cVar18 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var4,(key_type *)&image1);
    GraphicsPipelineBuilder::setShader
              (pGVar17,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,
               *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
    if (image1.m_format != (TextureFormat)(image1.m_size.m_data + 2)) {
      operator_delete((void *)image1.m_format,image1._16_8_ + 1);
    }
    if (image0.m_format != (TextureFormat)(image0.m_size.m_data + 2)) {
      operator_delete((void *)image0.m_format,image0._16_8_ + 1);
    }
    if ((&(this->m_params).pipelineCases[0].useTessellation)[lVar22] == true) {
      p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                *)((this->super_TestInstance).m_context)->m_progCollection;
      image0.m_format = (TextureFormat)(image0.m_size.m_data + 2);
      std::__cxx11::string::_M_construct<char_const*>((string *)&image0,"tesc","");
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(p_Var4,(key_type *)&image0);
      pGVar17 = GraphicsPipelineBuilder::setShader
                          (&pipelineBuilder,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                           *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       *)((this->super_TestInstance).m_context)->m_progCollection,
                      (key_type *)
                      ((long)&(this->m_params).pipelineCases[0].tessEvalShaderName._M_dataplus._M_p
                      + lVar22));
      GraphicsPipelineBuilder::setShader
                (pGVar17,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                 *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
      if (image0.m_format != (TextureFormat)(image0.m_size.m_data + 2)) {
        operator_delete((void *)image0.m_format,image0._16_8_ + 1);
      }
    }
    if ((&(this->m_params).pipelineCases[0].useGeometry)[lVar22] == true) {
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       *)((this->super_TestInstance).m_context)->m_progCollection,
                      (key_type *)
                      ((long)&(this->m_params).pipelineCases[0].geomShaderName._M_dataplus._M_p +
                      lVar22));
      GraphicsPipelineBuilder::setShader
                (&pipelineBuilder,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                 *(ProgramBinary **)(cVar18._M_node + 2),(VkSpecializationInfo *)0x0);
    }
    GraphicsPipelineBuilder::build
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&image0,&pipelineBuilder,vk,device,
               (VkPipelineLayout)pipelineLayout.m_data,local_428);
    image1.m_size.m_data[2] = image0.m_size.m_data[2];
    image1.m_pitch.m_data[0] = image0.m_pitch.m_data[0];
    image1.m_pitch.m_data[1] = image0.m_pitch.m_data[1];
    image1.m_pitch.m_data[2] = image0.m_pitch.m_data[2];
    image1.m_format = image0.m_format;
    image1.m_size.m_data[0] = image0.m_size.m_data[0];
    image1.m_size.m_data[1] = image0.m_size.m_data[1];
    beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer.m_data);
    oldLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
    if (lVar22 == 0) {
      oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    }
    subresourceRange_00.levelCount._0_1_ = 1;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00._9_7_ = 0;
    subresourceRange_00.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&image0,(uint)(lVar22 != 0) << 0xb,0x100,oldLayout,
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
               (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                        m_data.object.m_internal,subresourceRange_00);
    uVar24 = SUB84((VkImageMemoryBarrier *)&image0,0);
    (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer.m_data,0x1001,0x80,0,0,0,0,0,1,uVar24);
    image0.m_format.order = R;
    image0.m_format.type = SNORM_INT8;
    image0.m_size.m_data[0] = renderSize.m_data[0];
    image0.m_size.m_data[1] = renderSize.m_data[1];
    colorThreshold.m_data[0] = 0;
    colorThreshold.m_data[1] = 0;
    colorThreshold.m_data[2] = 0;
    colorThreshold.m_data[3] = 0x3f800000;
    beginRenderPass(vk,(VkCommandBuffer)commandBuffer.m_data,local_428,local_178,(VkRect2D *)&image0
                    ,(Vec4 *)&colorThreshold);
    (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer.m_data,0,image1.m_format);
    image0.m_format.order = R;
    image0.m_format.type = SNORM_INT8;
    (*vk->_vptr_DeviceInterface[0x58])
              (vk,commandBuffer.m_data,0,1,&vertexBuffer,(VkImageMemoryBarrier *)&image0);
    if ((this->m_params).useTessLevels == true) {
      (*vk->_vptr_DeviceInterface[0x56])
                (vk,commandBuffer.m_data,0,pipelineLayout.m_data,0,1,&local_448,0,0);
    }
    (*vk->_vptr_DeviceInterface[0x59])
              (vk,commandBuffer.m_data,
               (ulong)((long)(this->m_params).vertices.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_params).vertices.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4,1,0,0);
    endRenderPass(vk,(VkCommandBuffer)commandBuffer.m_data);
    subresourceRange_01.levelCount._0_1_ = 1;
    subresourceRange_01.aspectMask = 1;
    subresourceRange_01.baseMipLevel = 0;
    subresourceRange_01._9_7_ = 0;
    subresourceRange_01.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&image0,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
               VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
               (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                        m_data.object.m_internal,subresourceRange_01);
    (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer.m_data,0x400,0x1000,0,0,0,0,0,1,uVar24);
    subresourceLayers.baseArrayLayer = 0;
    subresourceLayers.layerCount = 1;
    subresourceLayers.aspectMask = 1;
    subresourceLayers.mipLevel = 0;
    extent.depth = 1;
    extent.width = renderSize.m_data[0];
    extent.height = renderSize.m_data[1];
    makeBufferImageCopy((VkBufferImageCopy *)&image0,extent,subresourceLayers);
    pBVar5 = *ppBVar23;
    (*vk->_vptr_DeviceInterface[99])
              (vk,commandBuffer.m_data,
               colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
               object.m_internal,6,
               (pBVar5->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,1,uVar24);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)&image0,0x1000,0x2000,
               (VkBuffer)
               (pBVar5->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,VVar21);
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,commandBuffer.m_data,0x1000,0x4000,0,0,0,1,(VkImageMemoryBarrier *)&image0,0,0);
    endCommandBuffer(vk,(VkCommandBuffer)commandBuffer.m_data);
    submitCommandsAndWait(vk,device,local_400,(VkCommandBuffer)commandBuffer.m_data);
    if (image1.m_format != (TextureFormat)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&image1.m_size,
                 (VkPipeline)image1.m_format);
    }
    GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&pipelineBuilder);
    lVar22 = lVar22 + 0x68;
    ppBVar23 = ppBVar23 + 1;
  } while (lVar22 == 0x68);
  pAVar6 = (colorBuffer[0]->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,VVar21);
  pipelineBuilder.m_renderSize.m_data = (int  [2])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&image0,(TextureFormat *)&pipelineBuilder,renderSize.m_data[0],renderSize.m_data[1],1,
             pAVar6->m_hostPtr);
  pAVar6 = (colorBuffer[1]->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar6->m_memory).m_internal,pAVar6->m_offset,VVar21);
  pipelineBuilder.m_renderSize.m_data = (int  [2])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&image1,(TextureFormat *)&pipelineBuilder,renderSize.m_data[0],renderSize.m_data[1],1,
             pAVar6->m_hostPtr);
  colorThreshold.m_data[0] = 8;
  colorThreshold.m_data[1] = 8;
  colorThreshold.m_data[2] = 8;
  colorThreshold.m_data[3] = 0xff;
  positionDeviation.m_data[0] = 1;
  positionDeviation.m_data[1] = 1;
  positionDeviation.m_data[2] = 0;
  aiVar3 = (int  [2])((this->super_TestInstance).m_context)->m_testCtx->m_log;
  pMVar1 = &pipelineBuilder.m_vertexShaderModule;
  pipelineBuilder.m_renderSize.m_data = aiVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pMVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pMVar1,"In image comparison:\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pMVar1,"  Reference - ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pMVar1,(this->m_params).pipelineCases[0].description._M_dataplus._M_p,
             (this->m_params).pipelineCases[0].description._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pMVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pMVar1,"  Result    - ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pMVar1,(this->m_params).pipelineCases[1].description._M_dataplus._M_p,
             (this->m_params).pipelineCases[1].description._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pMVar1,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&pipelineBuilder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pMVar1);
  std::ios_base::~ios_base
            ((ios_base *)
             &pipelineBuilder.m_tessControlShaderModule.
              super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device);
  bVar12 = tcu::intThresholdPositionDeviationCompare
                     ((TestLog *)aiVar3,"ImageCompare","Image comparison",&image0,&image1,
                      &colorThreshold,&positionDeviation,true,COMPARE_LOG_RESULT);
  pTVar8 = local_408;
  if (bVar12) {
    pipelineBuilder.m_renderSize.m_data =
         (int  [2])
         &pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
          .deleter;
    std::__cxx11::string::_M_construct<char_const*>((string *)&pipelineBuilder,"OK","");
    pTVar8->m_code = QP_TEST_RESULT_PASS;
    (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar8->m_description,pipelineBuilder.m_renderSize.m_data,
               pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
               m_data.object.m_internal + (long)pipelineBuilder.m_renderSize.m_data);
  }
  else {
    pipelineBuilder.m_renderSize.m_data =
         (int  [2])
         &pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
          .deleter;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&pipelineBuilder,"Image comparison failed","");
    pTVar8->m_code = QP_TEST_RESULT_FAIL;
    (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar8->m_description,pipelineBuilder.m_renderSize.m_data,
               pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
               m_data.object.m_internal + (long)pipelineBuilder.m_renderSize.m_data);
  }
  if (pipelineBuilder.m_renderSize.m_data !=
      (int  [2])
      &pipelineBuilder.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
       deleter) {
    operator_delete((void *)pipelineBuilder.m_renderSize.m_data,
                    (ulong)((long)&(pipelineBuilder.m_vertexShaderModule.
                                    super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                                   m_deviceIface)->_vptr_DeviceInterface + 1));
  }
  IVar19.m_data = pipelineBuilder.m_renderSize.m_data;
  if (commandBuffer.m_data != (int  [2])0x0) {
    pipelineBuilder.m_renderSize.m_data[0] = commandBuffer.m_data[0];
    pipelineBuilder.m_renderSize.m_data[1] = commandBuffer.m_data[1];
    image0.m_format.order = pipelineBuilder.m_renderSize.m_data[0];
    image0.m_format.type = pipelineBuilder.m_renderSize.m_data[1];
    pipelineBuilder.m_renderSize.m_data = IVar19.m_data;
    (**(code **)(*(long *)HVar9.m_internal + 0x240))(HVar9.m_internal,pDVar10,pVVar11,1);
  }
  if (obj.m_data != (int  [2])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_190,(VkCommandPool)obj.m_data);
  }
  if (pipelineLayout.m_data != (int  [2])0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_3d0,(VkPipelineLayout)pipelineLayout.m_data);
  }
  if (local_178.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_170,local_178);
  }
  if (local_428.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_420,local_428);
  }
  if (local_158.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_150,local_158);
  }
  if (colorBuffer2.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorBuffer2.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorBuffer2.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (colorBuffer2.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&colorBuffer2.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               colorBuffer2.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (colorBuffer1.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorBuffer1.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorBuffer1.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (colorBuffer1.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&colorBuffer1.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               colorBuffer1.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (colorAttachmentImage.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorAttachmentImage.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                deleter,(VkImage)colorAttachmentImage.m_image.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
  }
  if (local_448 != (TextureFormat)0x0) {
    image0.m_format = local_448;
    (**(code **)(*plStack_440 + 0x1e8))(plStack_440,local_438,pVStack_430,1);
  }
  if (local_138.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_130,local_138);
  }
  if (local_3b8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&DStack_3b0,(VkDescriptorSetLayout)local_3b8);
  }
  if (vertexBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(vertexBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (tessLevelsBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(tessLevelsBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    tessLevelsBuffer.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                deleter,(VkBuffer)
                        tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                        m_data.object.m_internal);
  }
  return pTVar8;
}

Assistant:

tcu::TestStatus PassthroughTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);
	DE_STATIC_ASSERT(PIPELINE_CASES == 2);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Tessellation levels
	const Buffer tessLevelsBuffer (vk, device, allocator, makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	if (m_params.useTessLevels)
	{
		const Allocation& alloc = tessLevelsBuffer.getAllocation();
		TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
		*bufferTessLevels = m_params.tessLevels;
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
	}

	// Vertex attributes

	const VkDeviceSize	vertexDataSizeBytes = sizeInBytes(m_params.vertices);
	const VkFormat		vertexFormat		= VK_FORMAT_R32G32B32A32_SFLOAT;
	const Buffer		vertexBuffer		(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &m_params.vertices[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Descriptors - make descriptor for tessellation levels, even if we don't use them, to simplify code

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet		   (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  tessLevelsBufferInfo = makeDescriptorBufferInfo(*tessLevelsBuffer, 0ull, sizeof(TessLevels));

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.update(vk, device);

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification.
	//                      We use two buffers, one for each case.

	const VkDeviceSize	colorBufferSizeBytes		= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer1				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer		colorBuffer2				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);
	const Buffer* const colorBuffer[PIPELINE_CASES] = { &colorBuffer1, &colorBuffer2 };

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Message explaining the test
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		log << tcu::TestLog::Message << m_params.message << tcu::TestLog::EndMessage;

		if (m_params.useTessLevels)
			log << tcu::TestLog::Message << "Tessellation levels: " << getTessellationLevelsString(m_params.tessLevels, m_params.primitiveType) << tcu::TestLog::EndMessage;
	}

	for (int pipelineNdx = 0; pipelineNdx < PIPELINE_CASES; ++pipelineNdx)
	{
		const PipelineDescription& pipelineDescription = m_params.pipelineCases[pipelineNdx];
		GraphicsPipelineBuilder	   pipelineBuilder;

		pipelineBuilder
			.setPrimitiveTopology		  (getPrimitiveTopology(m_params.primitiveType))
			.setRenderSize				  (renderSize)
			.setBlend					  (true)
			.setVertexInputSingleAttribute(vertexFormat, tcu::getPixelSize(mapVkFormat(vertexFormat)))
			.setPatchControlPoints		  (m_params.inputPatchVertices)
			.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
			.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL);

		if (pipelineDescription.useTessellation)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
				.setShader				  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(pipelineDescription.tessEvalShaderName), DE_NULL);

		if (pipelineDescription.useGeometry)
			pipelineBuilder
				.setShader				  (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				m_context.getBinaryCollection().get(pipelineDescription.geomShaderName), DE_NULL);

		const Unique<VkPipeline> pipeline (pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

		// Draw commands

		beginCommandBuffer(vk, *cmdBuffer);

		// Change color attachment image layout
		{
			// State is slightly different on the first iteration.
			const VkImageLayout currentLayout = (pipelineNdx == 0 ? VK_IMAGE_LAYOUT_UNDEFINED : VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);
			const VkAccessFlags srcFlags	  = (pipelineNdx == 0 ? (VkAccessFlags)0          : (VkAccessFlags)VK_ACCESS_TRANSFER_READ_BIT);

			const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
				srcFlags, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
				currentLayout, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT | VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
		}

		// Begin render pass
		{
			const VkRect2D renderArea = {
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

			beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
		}

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		if (m_params.useTessLevels)
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(m_params.vertices.size()), 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		// Copy render result to a host-visible buffer
		{
			const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
				VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
				VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
				*colorAttachmentImage, colorImageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
		}
		{
			const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, colorBuffer[pipelineNdx]->get(), 1u, &copyRegion);
		}
		{
			const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, colorBuffer[pipelineNdx]->get(), 0ull, colorBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Verify results

	tcu::ConstPixelBufferAccess image0 = getPixelBufferAccess(vk, device, *colorBuffer[0], colorFormat, colorBufferSizeBytes, renderSize);
	tcu::ConstPixelBufferAccess image1 = getPixelBufferAccess(vk, device, *colorBuffer[1], colorFormat, colorBufferSizeBytes, renderSize);

	const tcu::UVec4 colorThreshold    (8, 8, 8, 255);
	const tcu::IVec3 positionDeviation (1, 1, 0);		// 3x3 search kernel
	const bool		 ignoreOutOfBounds = true;

	tcu::TestLog& log = m_context.getTestContext().getLog();
	log << tcu::TestLog::Message
		<< "In image comparison:\n"
		<< "  Reference - " << m_params.pipelineCases[0].description << "\n"
		<< "  Result    - " << m_params.pipelineCases[1].description << "\n"
		<< tcu::TestLog::EndMessage;

	const bool ok = tcu::intThresholdPositionDeviationCompare(
		log, "ImageCompare", "Image comparison", image0, image1, colorThreshold, positionDeviation, ignoreOutOfBounds, tcu::COMPARE_LOG_RESULT);

	return (ok ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}